

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmMoves<(moira::Instr)132,(moira::Mode)7,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  bool bVar2;
  u32 uVar3;
  StrWriter *pSVar4;
  Mode M;
  undefined6 in_register_0000000a;
  Moira *this_00;
  Size in_R8D;
  Rn rn;
  Ea<(moira::Mode)7,_1> ea;
  Av<(moira::Instr)132,_(moira::Mode)7,_1> local_48;
  u32 local_44;
  ushort local_40;
  u32 local_3c;
  
  uVar1 = *addr;
  M = (Mode)CONCAT62(in_register_0000000a,op);
  uVar3 = dasmIncRead<2>(this,addr);
  local_40 = op & 7;
  local_44 = *addr;
  this_00 = this;
  local_3c = dasmIncRead<2>(this,addr);
  if (str->style->syntax != MUSASHI) {
    bVar2 = isAvailable(this_00,this->dasmModel,MOVES,M,in_R8D,(u16)uVar3);
    if (!bVar2) {
      *addr = uVar1;
      dasmIllegal<(moira::Instr)132,(moira::Mode)7,1>(this,str,addr,op);
      return;
    }
  }
  rn.raw = uVar3 >> 0xc & 0xf;
  pSVar4 = StrWriter::operator<<(str);
  pSVar4 = StrWriter::operator<<(pSVar4);
  StrWriter::operator<<(pSVar4,(Tab)(str->tab).raw);
  if ((uVar3 >> 0xb & 1) == 0) {
    StrWriter::operator<<(pSVar4,(Ea<(moira::Mode)7,_1> *)&local_44);
    StrWriter::operator<<(pSVar4);
    StrWriter::operator<<(pSVar4,rn);
  }
  else {
    StrWriter::operator<<(pSVar4,rn);
    StrWriter::operator<<(pSVar4);
    StrWriter::operator<<(pSVar4,(Ea<(moira::Mode)7,_1> *)&local_44);
  }
  local_48.ext1 = 0;
  StrWriter::operator<<(str,&local_48);
  return;
}

Assistant:

void
Moira::dasmMoves(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = (u16)dasmIncRead<Word>(addr);
    auto ea = Op <M,S> ( _____________xxx(op), addr );
    auto rg = Rn ( xxxx____________(ext) );

    if (str.style.syntax != Syntax::MUSASHI && !isAvailable(dasmModel, I, M, S, ext)) {

        addr = old;
        dasmIllegal<I, M, S>(str, addr, op);
        return;
    }

    if (ext & 0x800) {      // Rg -> Ea
        str << Ins<I>{} << Sz<S>{} << str.tab << rg << Sep{} << ea;
    } else {                // Ea -> Rg
        str << Ins<I>{} << Sz<S>{} << str.tab << ea << Sep{} << rg;
    }
    str << Av<I, M, S>{};
}